

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O1

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  
  iVar1 = this->order_max;
  if (0 < (long)iVar1) {
    pdVar3 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->Qn2_vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->Qn2_vector_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->npT;
    pvVar7 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->QnSP_diff_vector).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (this->QnSP_diff_vector_err).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      dVar18 = pdVar4[lVar17];
      dVar18 = (pdVar3[lVar17] * pdVar3[lVar17] + dVar18 * dVar18) - *pdVar3;
      pdVar5[lVar17] = pdVar5[lVar17] + dVar18;
      pdVar6[lVar17] = dVar18 * dVar18 + pdVar6[lVar17];
      if (0 < (int)uVar2) {
        lVar11 = *(long *)&pvVar7[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl;
        lVar12 = *(long *)&pvVar8[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar13 = *(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        lVar14 = *(long *)&pvVar9[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        lVar15 = *(long *)&pvVar10[lVar17].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar16 = 0;
        do {
          dVar18 = (*(double *)(lVar11 + uVar16 * 8) * pdVar3[lVar17] +
                   *(double *)(lVar12 + uVar16 * 8) * pdVar4[lVar17]) -
                   *(double *)(lVar13 + uVar16 * 8);
          *(double *)(lVar14 + uVar16 * 8) = *(double *)(lVar14 + uVar16 * 8) + dVar18;
          *(double *)(lVar15 + uVar16 * 8) = dVar18 * dVar18 + *(double *)(lVar15 + uVar16 * 8);
          uVar16 = uVar16 + 1;
        } while (uVar2 != uVar16);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != iVar1);
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation(
    vector<double> &event_Qn_real, vector<double> &event_Qn_imag,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_imag) {
    for (int i = 0; i < order_max; i++) {
        double Q2_local =
            (event_Qn_real[i] * event_Qn_real[i]
             + event_Qn_imag[i] * event_Qn_imag[i] - event_Qn_real[0]);
        Qn2_vector[i] += Q2_local;
        Qn2_vector_err[i] += Q2_local * Q2_local;
        for (int j = 0; j < npT; j++) {
            double QnSP_pT_local =
                (event_Qn_diff_real[i][j] * event_Qn_real[i]
                 + event_Qn_diff_imag[i][j] * event_Qn_imag[i]
                 - event_Qn_diff_real[0][j]);
            QnSP_diff_vector[i][j] += QnSP_pT_local;
            QnSP_diff_vector_err[i][j] += QnSP_pT_local * QnSP_pT_local;
        }
    }
}